

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall capnp::anon_unknown_79::Parser::parseValue(Parser *this,Builder *output)

{
  Input *this_00;
  byte *pbVar1;
  char *pcVar2;
  undefined2 *puVar3;
  double dVar4;
  Builder builder;
  Builder builder_00;
  byte bVar5;
  bool bVar6;
  char cVar7;
  ulong uVar8;
  long lVar9;
  Orphan<capnp::json::Value> *pOVar10;
  Fault FVar11;
  Array<char> *this_01;
  unsigned_long i;
  long lVar12;
  long lVar13;
  ArrayPtr<const_char> expected;
  ArrayPtr<const_char> expected_00;
  Reader value;
  ArrayPtr<const_char> expected_01;
  Reader value_00;
  Fault f;
  CapTableBuilder *in_stack_ffffffffffffff20;
  ArrayDisposer *in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff30 [24];
  Orphan<capnp::json::Value> orphan;
  Vector<capnp::Orphan<capnp::json::Value>_> values;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compat_json_c__:632:5)>
  _kjDefer632;
  ArrayPtr<const_char> numArrayPtr;
  Orphanage orphanage_1;
  
  this_00 = &this->input;
  Input::consumeWhitespace(this_00);
  _kjDefer632.canceled = false;
  _kjDefer632.func.this = this;
  if (((this->input).wrapped.size_ == 0) || (*(this_00->wrapped).ptr == '\0')) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x27a,FAILED,"!input.exhausted()","\"JSON message ends prematurely.\"",
               (char (*) [31])"JSON message ends prematurely.");
    kj::_::Debug::Fault::fatal(&f);
  }
  bVar5 = Input::nextChar(this_00);
  if (bVar5 - 0x30 < 10) {
LAB_003d6cb5:
    pcVar2 = (this_00->wrapped).ptr;
    Input::tryConsume(this_00,'-');
    bVar6 = Input::tryConsume(this_00,'0');
    if (!bVar6) {
      cVar7 = Input::nextChar(this_00);
      if (8 < (byte)(cVar7 - 0x31U)) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x24a,FAILED,"predicate(current)","\"Unexpected input in JSON message.\"",
                   (char (*) [34])"Unexpected input in JSON message.");
        kj::_::Debug::Fault::fatal(&f);
      }
      Input::advance(this_00,1);
      while ((((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0')) &&
             (cVar7 = Input::nextChar(this_00), (byte)(cVar7 - 0x30U) < 10))) {
        Input::advance(this_00,1);
      }
    }
    bVar6 = Input::tryConsume(this_00,'.');
    if (bVar6 && (this->input).wrapped.size_ != 0) {
      do {
        if ((*(this_00->wrapped).ptr == '\0') ||
           (cVar7 = Input::nextChar(this_00), 9 < (byte)(cVar7 - 0x30U))) break;
        Input::advance(this_00,1);
      } while ((this->input).wrapped.size_ != 0);
    }
    bVar6 = Input::tryConsume(this_00,'e');
    if ((bVar6) || (bVar6 = Input::tryConsume(this_00,'E'), bVar6)) {
      bVar6 = Input::tryConsume(this_00,'+');
      if (!bVar6) {
        Input::tryConsume(this_00,'-');
      }
      while ((((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0')) &&
             (cVar7 = Input::nextChar(this_00), (byte)(cVar7 - 0x30U) < 10))) {
        Input::advance(this_00,1);
      }
    }
    numArrayPtr.size_ = (long)(this_00->wrapped).ptr - (long)pcVar2;
    numArrayPtr.ptr = pcVar2;
    if (numArrayPtr.size_ == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x321,FAILED,"numArrayPtr.size() > 0","\"Expected number in JSON input.\"",
                 (char (*) [31])"Expected number in JSON input.");
      kj::_::Debug::Fault::fatal(&f);
    }
    f.exception = (Exception *)0x0;
    kj::Vector<char>::addAll<kj::ArrayPtr<char_const>&>((Vector<char> *)&f,&numArrayPtr);
    values.builder.ptr =
         (Orphan<capnp::json::Value> *)((ulong)values.builder.ptr & 0xffffffffffffff00);
    kj::Vector<char>::add<char>((Vector<char> *)&f,(char *)&values);
    kj::Vector<char>::releaseAsArray((Array<char> *)&values,(Vector<char> *)&f);
    orphan.builder.tag.content = (uint64_t)values.builder.ptr;
    orphan.builder.segment = (SegmentBuilder *)values.builder.pos;
    orphan.builder.capTable = (CapTableBuilder *)values.builder.endPtr;
    values.builder.ptr = (Orphan<capnp::json::Value> *)0x0;
    values.builder.pos = (RemoveConst<capnp::Orphan<capnp::json::Value>_> *)0x0;
    kj::Array<char>::~Array((Array<char> *)&values);
    kj::ArrayBuilder<char>::dispose((ArrayBuilder<char> *)&f);
    dVar4 = kj::String::parseAs<double>((String *)&orphan);
    puVar3 = (undefined2 *)(output->_builder).data;
    *puVar3 = 2;
    *(double *)(puVar3 + 4) = dVar4;
    this_01 = (Array<char> *)&orphan;
  }
  else {
    if (bVar5 != 0x22) {
      if (bVar5 != 0x2d) {
        if (bVar5 == 0x5b) {
          values.builder.ptr = (Orphan<capnp::json::Value> *)0x0;
          values.builder.pos = (RemoveConst<capnp::Orphan<capnp::json::Value>_> *)0x0;
          values.builder.endPtr = (Orphan<capnp::json::Value> *)0x0;
          builder._builder.capTable = (CapTableBuilder *)in_stack_ffffffffffffff28;
          builder._builder.segment = (SegmentBuilder *)in_stack_ffffffffffffff20;
          builder._builder.data = (void *)in_stack_ffffffffffffff30._0_8_;
          builder._builder.pointers = (WirePointer *)in_stack_ffffffffffffff30._8_8_;
          builder._builder.dataSize = in_stack_ffffffffffffff30._16_4_;
          builder._builder.pointerCount = in_stack_ffffffffffffff30._20_2_;
          builder._builder._38_2_ = in_stack_ffffffffffffff30._22_2_;
          numArrayPtr = (ArrayPtr<const_char>)
                        Orphanage::getForMessageContaining<capnp::json::Value::Builder>(builder);
          Input::consume(this_00,'[');
          uVar8 = this->nestingDepth + 1;
          this->nestingDepth = uVar8;
          if (this->maxNestingDepth < uVar8) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x29b,FAILED,"++nestingDepth <= maxNestingDepth",
                       "\"JSON message nested too deeply.\"",
                       (char (*) [32])"JSON message nested too deeply.");
            kj::_::Debug::Fault::fatal(&f);
          }
          bVar6 = false;
          while( true ) {
            Input::consumeWhitespace(this_00);
            cVar7 = Input::nextChar(this_00);
            if (cVar7 == ']') break;
            Orphanage::newOrphan<capnp::json::Value>
                      ((Orphan<capnp::json::Value> *)&orphan.builder,(Orphanage *)&numArrayPtr);
            capnp::_::OrphanGetImpl<capnp::json::Value,_(capnp::Kind)3>::apply
                      ((Builder *)&f,&orphan.builder);
            if (bVar6) {
              Input::consumeWhitespace(this_00);
              Input::consume(this_00,',');
              Input::consumeWhitespace(this_00);
            }
            parseValue(this,(Builder *)&f);
            kj::Vector<capnp::Orphan<capnp::json::Value>>::add<capnp::Orphan<capnp::json::Value>>
                      ((Vector<capnp::Orphan<capnp::json::Value>> *)&values,
                       (Orphan<capnp::json::Value> *)&orphan.builder);
            capnp::_::OrphanBuilder::~OrphanBuilder(&orphan.builder);
            bVar6 = true;
          }
          capnp::json::Value::Builder::initArray
                    ((Builder *)&f,output,
                     (uint)((ulong)((long)values.builder.pos - (long)values.builder.ptr) >> 5));
          capnp::json::Value::Builder::getArray((Builder *)&f,output);
          lVar13 = (long)values.builder.pos - (long)values.builder.ptr;
          lVar9 = 0;
          for (lVar12 = 0; lVar13 >> 5 != lVar12; lVar12 = lVar12 + 1) {
            List<capnp::json::Value,_(capnp::Kind)3>::Builder::adoptWithCaveats
                      ((Builder *)&f,(uint)lVar12,
                       (Orphan<capnp::json::Value> *)
                       ((long)&((values.builder.ptr)->builder).tag.content + lVar9));
            lVar9 = lVar9 + 0x20;
          }
          Input::consume(this_00,']');
          this->nestingDepth = this->nestingDepth - 1;
          kj::ArrayBuilder<capnp::Orphan<capnp::json::Value>_>::dispose(&values.builder);
        }
        else if (bVar5 == 0x66) {
          expected_00.size_ = 5;
          expected_00.ptr = "false";
          Input::consume(this_00,expected_00);
          puVar3 = (undefined2 *)(output->_builder).data;
          *puVar3 = 1;
          pbVar1 = (byte *)(puVar3 + 1);
          *pbVar1 = *pbVar1 & 0xfe;
        }
        else if (bVar5 == 0x7b) {
          orphan.builder.tag.content = 0;
          orphan.builder.segment = (SegmentBuilder *)0x0;
          orphan.builder.capTable = (CapTableBuilder *)0x0;
          builder_00._builder.capTable = (CapTableBuilder *)in_stack_ffffffffffffff28;
          builder_00._builder.segment = (SegmentBuilder *)in_stack_ffffffffffffff20;
          builder_00._builder.data = (void *)in_stack_ffffffffffffff30._0_8_;
          builder_00._builder.pointers = (WirePointer *)in_stack_ffffffffffffff30._8_8_;
          builder_00._builder.dataSize = in_stack_ffffffffffffff30._16_4_;
          builder_00._builder.pointerCount = in_stack_ffffffffffffff30._20_2_;
          builder_00._builder._38_2_ = in_stack_ffffffffffffff30._22_2_;
          orphanage_1 = Orphanage::getForMessageContaining<capnp::json::Value::Builder>(builder_00);
          Input::consume(this_00,'{');
          uVar8 = this->nestingDepth + 1;
          this->nestingDepth = uVar8;
          if (this->maxNestingDepth < uVar8) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x2be,FAILED,"++nestingDepth <= maxNestingDepth",
                       "\"JSON message nested too deeply.\"",
                       (char (*) [32])"JSON message nested too deeply.");
            kj::_::Debug::Fault::fatal(&f);
          }
          bVar6 = false;
          while( true ) {
            Input::consumeWhitespace(this_00);
            cVar7 = Input::nextChar(this_00);
            if (cVar7 == '}') break;
            Orphanage::newOrphan<capnp::json::Value::Field>
                      ((Orphan<capnp::json::Value::Field> *)&numArrayPtr,&orphanage_1);
            capnp::_::OrphanGetImpl<capnp::json::Value::Field,_(capnp::Kind)3>::apply
                      ((Builder *)&f,(OrphanBuilder *)&numArrayPtr);
            if (bVar6) {
              Input::consumeWhitespace(this_00);
              Input::consume(this_00,',');
              Input::consumeWhitespace(this_00);
            }
            consumeQuotedString((String *)&values,this);
            pOVar10 = (Orphan<capnp::json::Value> *)0x514074;
            if (values.builder.pos != (RemoveConst<capnp::Orphan<capnp::json::Value>_> *)0x0) {
              pOVar10 = values.builder.ptr;
            }
            value.super_StringPtr.content.size_ =
                 (long)&((values.builder.pos)->builder).tag.content +
                 (ulong)(values.builder.pos ==
                        (RemoveConst<capnp::Orphan<capnp::json::Value>_> *)0x0);
            value.super_StringPtr.content.ptr = (char *)pOVar10;
            capnp::json::Value::Field::Builder::setName((Builder *)&f,value);
            kj::Array<char>::~Array((Array<char> *)&values);
            Input::consumeWhitespace(this_00);
            Input::consume(this_00,':');
            Input::consumeWhitespace(this_00);
            capnp::json::Value::Field::Builder::getValue((Builder *)&values,(Builder *)&f);
            parseValue(this,(Builder *)&values);
            kj::Vector<capnp::Orphan<capnp::json::Value::Field>>::
            add<capnp::Orphan<capnp::json::Value::Field>>
                      ((Vector<capnp::Orphan<capnp::json::Value::Field>> *)&orphan,
                       (Orphan<capnp::json::Value::Field> *)&numArrayPtr);
            capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&numArrayPtr);
            bVar6 = true;
          }
          capnp::json::Value::Builder::initObject
                    ((Builder *)&f,output,
                     (uint)((long)orphan.builder.segment - orphan.builder.tag.content >> 5));
          capnp::json::Value::Builder::getObject((Builder *)&f,output);
          lVar13 = (long)orphan.builder.segment - orphan.builder.tag.content;
          lVar9 = 0;
          for (lVar12 = 0; lVar13 >> 5 != lVar12; lVar12 = lVar12 + 1) {
            List<capnp::json::Value::Field,_(capnp::Kind)3>::Builder::adoptWithCaveats
                      ((Builder *)&f,(uint)lVar12,
                       (Orphan<capnp::json::Value::Field> *)(orphan.builder.tag.content + lVar9));
            lVar9 = lVar9 + 0x20;
          }
          Input::consume(this_00,'}');
          this->nestingDepth = this->nestingDepth - 1;
          kj::ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_>::dispose
                    ((ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_> *)&orphan);
        }
        else if (bVar5 == 0x74) {
          expected_01.size_ = 4;
          expected_01.ptr = "true";
          Input::consume(this_00,expected_01);
          puVar3 = (undefined2 *)(output->_builder).data;
          *puVar3 = 1;
          pbVar1 = (byte *)(puVar3 + 1);
          *pbVar1 = *pbVar1 | 1;
        }
        else {
          if (bVar5 != 0x6e) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x286,FAILED,(char *)0x0,"\"Unexpected input in JSON message.\"",
                       (char (*) [34])"Unexpected input in JSON message.");
            kj::_::Debug::Fault::fatal(&f);
          }
          expected.size_ = 4;
          expected.ptr = "null";
          Input::consume(this_00,expected);
          *(undefined2 *)(output->_builder).data = 0;
        }
        goto LAB_003d6e36;
      }
      goto LAB_003d6cb5;
    }
    consumeQuotedString((String *)&f,this);
    FVar11 = f;
    if (in_stack_ffffffffffffff20 == (CapTableBuilder *)0x0) {
      FVar11.exception = (Exception *)0x514074;
    }
    value_00.super_StringPtr.content.size_ =
         (RemoveConst<char> *)
         ((long)&(in_stack_ffffffffffffff20->super_CapTableReader)._vptr_CapTableReader +
         (ulong)(in_stack_ffffffffffffff20 == (CapTableBuilder *)0x0));
    value_00.super_StringPtr.content.ptr = (char *)FVar11.exception;
    capnp::json::Value::Builder::setString(output,value_00);
    this_01 = (Array<char> *)&f;
  }
  kj::Array<char>::~Array(this_01);
LAB_003d6e36:
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++:632:5)>
  ::~Deferred(&_kjDefer632);
  return;
}

Assistant:

void parseValue(JsonValue::Builder& output) {
    input.consumeWhitespace();
    KJ_DEFER(input.consumeWhitespace());

    KJ_REQUIRE(!input.exhausted(), "JSON message ends prematurely.");

    switch (input.nextChar()) {
      case 'n': input.consume(kj::StringPtr("null"));  output.setNull();         break;
      case 'f': input.consume(kj::StringPtr("false")); output.setBoolean(false); break;
      case 't': input.consume(kj::StringPtr("true"));  output.setBoolean(true);  break;
      case '"': parseString(output); break;
      case '[': parseArray(output);  break;
      case '{': parseObject(output); break;
      case '-': case '0': case '1': case '2': case '3':
      case '4': case '5': case '6': case '7': case '8':
      case '9': parseNumber(output); break;
      default: KJ_FAIL_REQUIRE("Unexpected input in JSON message.");
    }
  }